

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

UInt32 CrcUpdateT4(UInt32 v,void *data,size_t size,UInt32 *table)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  Byte *p;
  uint uVar4;
  
  if (((ulong)data & 3) != 0 && size != 0) {
    uVar2 = (long)data + 1;
    sVar3 = size;
    do {
      v = v >> 8 ^ table[(byte)((byte)*data ^ (byte)v)];
      size = sVar3 - 1;
      data = (void *)((long)data + 1);
      if (sVar3 == 1) break;
      uVar1 = uVar2 & 3;
      uVar2 = uVar2 + 1;
      sVar3 = size;
    } while (uVar1 != 0);
  }
  for (; 3 < size; size = size - 4) {
    uVar4 = v ^ *data;
    v = *(uint *)((long)table + (ulong)(uVar4 >> 6 & 0x3fc) + 0x800) ^
        table[(ulong)(uVar4 & 0xff) + 0x300] ^
        *(uint *)((long)table + (ulong)(uVar4 >> 0xe & 0x3fc) + 0x400) ^ table[uVar4 >> 0x18];
    data = (void *)((long)data + 4);
  }
  if (size != 0) {
    uVar2 = 0;
    do {
      v = v >> 8 ^ table[(byte)(*(byte *)((long)data + uVar2) ^ (byte)v)];
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return v;
}

Assistant:

static UInt32 MY_FAST_CALL CrcUpdateT4(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 3) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 4; size -= 4, p += 4)
  {
    v ^= *(const UInt32 *)p;
    v =
          table[0x300 + ((v      ) & 0xFF)]
        ^ table[0x200 + ((v >>  8) & 0xFF)]
        ^ table[0x100 + ((v >> 16) & 0xFF)]
        ^ table[0x000 + ((v >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}